

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidSchema.cc
# Opt level: O0

void __thiscall avro::ValidSchema::ValidSchema(ValidSchema *this)

{
  shared_ptr<avro::Node> *in_RDI;
  shared_ptr<avro::Node> *in_stack_ffffffffffffffa8;
  Schema *this_00;
  shared_count in_stack_fffffffffffffff0;
  
  this_00 = (Schema *)&stack0xffffffffffffffe0;
  NullSchema::NullSchema((NullSchema *)this_00);
  Schema::root(this_00);
  boost::shared_ptr<avro::Node>::shared_ptr(in_RDI,in_stack_ffffffffffffffa8);
  NullSchema::~NullSchema((NullSchema *)0x1f7c61);
  validate((NodePtr *)in_stack_fffffffffffffff0.pi_);
  return;
}

Assistant:

ValidSchema::ValidSchema() : root_(NullSchema().root()) 
{
    validate(root_);
}